

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# po_man.cpp
# Opt level: O0

void __thiscall FPolyObj::ClosestPoint(FPolyObj *this,DVector2 *fpos,DVector2 *out,side_t **side)

{
  uint uVar1;
  uint uVar2;
  side_t **ppsVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  TVector2<double> local_c0;
  double local_b0;
  double u;
  double num;
  double dist;
  double iy;
  double ix;
  double den;
  double b;
  double a;
  vertex_t *v2;
  vertex_t *v1;
  side_t *bestline;
  double besty;
  double bestx;
  double bestdist;
  double y;
  double x;
  side_t **ppsStack_28;
  uint i;
  side_t **side_local;
  DVector2 *out_local;
  DVector2 *fpos_local;
  FPolyObj *this_local;
  
  y = fpos->X;
  bestdist = fpos->Y;
  bestx = INFINITY;
  besty = 0.0;
  bestline = (side_t *)0x0;
  v1 = (vertex_t *)0x0;
  ppsStack_28 = side;
  side_local = (side_t **)out;
  out_local = fpos;
  fpos_local = (DVector2 *)this;
  for (x._4_4_ = 0; uVar1 = x._4_4_, uVar2 = TArray<side_t_*,_side_t_*>::Size(&this->Sidedefs),
      uVar1 < uVar2; x._4_4_ = x._4_4_ + 1) {
    ppsVar3 = TArray<side_t_*,_side_t_*>::operator[](&this->Sidedefs,(ulong)x._4_4_);
    v2 = side_t::V1(*ppsVar3);
    ppsVar3 = TArray<side_t_*,_side_t_*>::operator[](&this->Sidedefs,(ulong)x._4_4_);
    a = (double)side_t::V2(*ppsVar3);
    dVar4 = vertex_t::fX((vertex_t *)a);
    dVar5 = vertex_t::fX(v2);
    b = dVar4 - dVar5;
    dVar5 = vertex_t::fY((vertex_t *)a);
    dVar6 = vertex_t::fY(v2);
    dVar4 = y;
    den = dVar5 - dVar6;
    ix = b * b + den * den;
    if ((ix != 0.0) || (NAN(ix))) {
      dVar6 = vertex_t::fX(v2);
      dVar5 = bestdist;
      dVar4 = (dVar4 - dVar6) * b;
      dVar6 = vertex_t::fY(v2);
      u = dVar4 + (dVar5 - dVar6) * den;
      local_b0 = u / ix;
      if (0.0 < local_b0) {
        if (local_b0 < 1.0) {
          dVar4 = vertex_t::fX(v2);
          iy = dVar4 + local_b0 * b;
          dVar4 = vertex_t::fY(v2);
          dist = dVar4 + local_b0 * den;
        }
        else {
          iy = vertex_t::fX((vertex_t *)a);
          dist = vertex_t::fY((vertex_t *)a);
        }
      }
      else {
        iy = vertex_t::fX(v2);
        dist = vertex_t::fY(v2);
      }
    }
    else {
      iy = vertex_t::fX(v2);
      dist = vertex_t::fY(v2);
    }
    b = iy - y;
    den = dist - bestdist;
    num = b * b + den * den;
    if (num < bestx) {
      besty = iy;
      bestline = (side_t *)dist;
      bestx = num;
      ppsVar3 = TArray<side_t_*,_side_t_*>::operator[](&this->Sidedefs,(ulong)x._4_4_);
      v1 = (vertex_t *)*ppsVar3;
    }
  }
  TVector2<double>::TVector2(&local_c0,besty,(double)bestline);
  TVector2<double>::operator=((TVector2<double> *)side_local,&local_c0);
  if (ppsStack_28 != (side_t **)0x0) {
    *ppsStack_28 = (side_t *)v1;
  }
  return;
}

Assistant:

void FPolyObj::ClosestPoint(const DVector2 &fpos, DVector2 &out, side_t **side) const
{
	unsigned int i;
	double x = fpos.X, y = fpos.Y;
	double bestdist = HUGE_VAL;
	double bestx = 0, besty = 0;
	side_t *bestline = NULL;

	for (i = 0; i < Sidedefs.Size(); ++i)
	{
		vertex_t *v1 = Sidedefs[i]->V1();
		vertex_t *v2 = Sidedefs[i]->V2();
		double a = v2->fX() - v1->fX();
		double b = v2->fY() - v1->fY();
		double den = a*a + b*b;
		double ix, iy, dist;

		if (den == 0)
		{ // Line is actually a point!
			ix = v1->fX();
			iy = v1->fY();
		}
		else
		{
			double num = (x - v1->fX()) * a + (y - v1->fY()) * b;
			double u = num / den;
			if (u <= 0)
			{
				ix = v1->fX();
				iy = v1->fY();
			}
			else if (u >= 1)
			{
				ix = v2->fX();
				iy = v2->fY();
			}
			else
			{
				ix = v1->fX() + u * a;
				iy = v1->fY() + u * b;
			}
		}
		a = (ix - x);
		b = (iy - y);
		dist = a*a + b*b;
		if (dist < bestdist)
		{
			bestdist = dist;
			bestx = ix;
			besty = iy;
			bestline = Sidedefs[i];
		}
	}
	out = { bestx, besty };
	if (side != NULL)
	{
		*side = bestline;
	}
}